

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O1

vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> * __thiscall
dgrminer::PartialUnion::createAdjacencyLists
          (vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
           *__return_storage_ptr__,PartialUnion *this,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges,
          int snapshots)

{
  vector<int,std::allocator<int>> *pvVar1;
  _Rb_tree_header *p_Var2;
  iterator iVar3;
  iterator iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  pointer paVar9;
  pointer paVar10;
  undefined4 in_register_0000000c;
  ulong uVar11;
  int *piVar12;
  array<int,_8UL> *__args;
  ulong uVar13;
  long lVar14;
  int iVar15;
  vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *pvVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  ulong uVar19;
  int id_counter;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  *adjacency_lists;
  AdjacencyListCrate alc;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> adjacencyListNodes;
  vector<int,_std::allocator<int>_> numbers_of_nodes;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacencyMoreInfo;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacencyList;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> new_node_ids;
  int local_140;
  int local_13c;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *local_138;
  ulong local_130;
  value_type local_128;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> local_d8;
  void *local_b8;
  iterator iStack_b0;
  int *local_a8;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_98;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_90;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_130 = CONCAT44(in_register_0000000c,snapshots);
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  uVar13 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140 = 0;
  local_a8 = (int *)0x0;
  local_b8 = (void *)0x0;
  iStack_b0._M_current = (int *)0x0;
  paVar9 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->nodes).
                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 3) *
           -0x5555555555555555;
  uVar19 = 0;
  iVar15 = 1;
  local_138 = __return_storage_ptr__;
  local_98 = newedges;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  do {
    if ((uVar19 == uVar11) || (iVar15 < paVar9[uVar19]._M_elems[0])) {
      if (iStack_b0._M_current == local_a8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_b8,iStack_b0,&local_140);
      }
      else {
        *iStack_b0._M_current = local_140;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      paVar10 = (this->edges).
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(this->edges).
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 5;
      uVar11 = uVar13;
      if (uVar13 < uVar8) {
        do {
          uVar11 = uVar13;
          if (iVar15 < paVar10[uVar13]._M_elems[0]) break;
          p_Var17 = &p_Var2->_M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var18 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              if (paVar10[uVar13]._M_elems[1] <= (int)p_Var18[1]._M_color) {
                p_Var17 = p_Var18;
              }
              p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < paVar10[uVar13]._M_elems[1]];
            } while (p_Var18 != (_Base_ptr)0x0);
          }
          p_Var18 = &p_Var2->_M_header;
          if (((_Rb_tree_header *)p_Var17 != p_Var2) &&
             (p_Var18 = p_Var17, paVar10[uVar13]._M_elems[1] < (int)p_Var17[1]._M_color)) {
            p_Var18 = &p_Var2->_M_header;
          }
          paVar10[uVar13]._M_elems[1] = *(int *)&p_Var18[1].field_0x4;
          p_Var17 = &p_Var2->_M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var18 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              if (paVar10[uVar13]._M_elems[2] <= (int)p_Var18[1]._M_color) {
                p_Var17 = p_Var18;
              }
              p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < paVar10[uVar13]._M_elems[2]];
            } while (p_Var18 != (_Base_ptr)0x0);
          }
          p_Var18 = &p_Var2->_M_header;
          if (((_Rb_tree_header *)p_Var17 != p_Var2) &&
             (p_Var18 = p_Var17, paVar10[uVar13]._M_elems[2] < (int)p_Var17[1]._M_color)) {
            p_Var18 = &p_Var2->_M_header;
          }
          paVar10[uVar13]._M_elems[2] = *(int *)&p_Var18[1].field_0x4;
          uVar13 = uVar13 + 1;
          uVar11 = uVar8;
        } while (uVar13 != uVar8);
      }
      if (uVar19 == ((long)(this->nodes).
                           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
      break;
      local_13c = iVar15 + 1;
      local_140 = 0;
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&local_60);
      uVar13 = uVar11;
      iVar15 = local_13c;
    }
    local_13c = iVar15;
    local_128.adjacencyList.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_140,
                           (this->nodes).
                           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_elems[1]);
    std::
    _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
    ::_M_emplace_unique<std::pair<int,int>>
              ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                *)&local_60,(pair<int,_int> *)&local_128);
    (this->nodes).super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar19]._M_elems[1] = local_140;
    local_140 = local_140 + 1;
    uVar19 = uVar19 + 1;
    paVar9 = (this->nodes).
             super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = ((long)(this->nodes).
                    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 3) *
             -0x5555555555555555;
    iVar15 = local_13c;
  } while (uVar19 <= uVar11);
  (local_138->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_138->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_138->
  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)local_130) {
    local_130 = (ulong)((int)local_130 + 1);
    uVar13 = 1;
    uVar11 = 0;
    uVar19 = 0;
    do {
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_78,(long)*(int *)((long)local_b8 + uVar13 * 4 + -4),(value_type *)&local_128,
               (allocator_type *)&local_90);
      if (local_128.adjacencyList.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.adjacencyList.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::vector(&local_90,(long)*(int *)((long)local_b8 + uVar13 * 4 + -4),(value_type *)&local_128,
               (allocator_type *)&local_d8);
      if (local_128.adjacencyList.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.adjacencyList.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_d8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (array<int,_3UL> *)0x0;
      local_d8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (array<int,_3UL> *)0x0;
      paVar9 = (this->nodes).
               super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (uVar11 < (ulong)(((long)(this->nodes).
                                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 3) *
                          -0x5555555555555555)) {
        lVar14 = uVar11 * 0x18 + 0x10;
        do {
          if ((long)uVar13 < (long)*(int *)((long)paVar9->_M_elems + lVar14 + -0x10)) break;
          local_128.adjacencyList.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(*(undefined4 *)((long)paVar9->_M_elems + lVar14),
                                 *(undefined4 *)((long)paVar9->_M_elems + lVar14 + -0xc));
          iVar15 = *(int *)((long)paVar9->_M_elems + lVar14 + -8);
          local_128.adjacencyList.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_128.adjacencyList.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar15);
          if (local_d8.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_d8.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>::
            _M_realloc_insert<std::array<int,3ul>const&>
                      ((vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>> *)&local_d8,
                       (iterator)
                       local_d8.
                       super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(array<int,_3UL> *)&local_128);
          }
          else {
            (local_d8.
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->_M_elems[2] = iVar15;
            *(pointer *)
             (local_d8.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish)->_M_elems =
                 local_128.adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_d8.
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 local_d8.
                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar11 = uVar11 + 1;
          paVar9 = (this->nodes).
                   super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar14 = lVar14 + 0x18;
        } while (uVar11 < (ulong)(((long)(this->nodes).
                                         super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)paVar9
                                  >> 3) * -0x5555555555555555));
      }
      paVar10 = (this->edges).
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (uVar19 < (ulong)((long)(this->edges).
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 5)) {
        lVar14 = uVar19 << 5;
        do {
          if ((long)uVar13 < (long)*(int *)((long)paVar10->_M_elems + lVar14)) break;
          piVar12 = (int *)((long)paVar10->_M_elems + lVar14 + 8);
          pvVar1 = (vector<int,std::allocator<int>> *)
                   (local_78.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   *(int *)((long)paVar10->_M_elems + lVar14 + 4));
          iVar3._M_current = *(int **)(pvVar1 + 8);
          if (iVar3._M_current == *(int **)(pvVar1 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar1,iVar3,piVar12);
          }
          else {
            *iVar3._M_current = *piVar12;
            *(int **)(pvVar1 + 8) = iVar3._M_current + 1;
          }
          paVar10 = (this->edges).
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          piVar12 = (int *)((long)paVar10->_M_elems + lVar14 + 4);
          pvVar1 = (vector<int,std::allocator<int>> *)
                   (local_78.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   *(int *)((long)paVar10->_M_elems + lVar14 + 8));
          iVar3._M_current = *(int **)(pvVar1 + 8);
          if (iVar3._M_current == *(int **)(pvVar1 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar1,iVar3,piVar12);
          }
          else {
            *iVar3._M_current = *piVar12;
            *(int **)(pvVar1 + 8) = iVar3._M_current + 1;
          }
          pvVar16 = (vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)
                    (local_90.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                    *(int *)((long)((this->edges).
                                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                            lVar14 + 4));
          __args = (array<int,_8UL> *)
                   ((long)((local_98->
                           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar14);
          iVar4._M_current = *(array<int,_8UL> **)(pvVar16 + 8);
          if (iVar4._M_current == *(array<int,_8UL> **)(pvVar16 + 0x10)) {
            std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
            _M_realloc_insert<std::array<int,8ul>const&>(pvVar16,iVar4,__args);
          }
          else {
            uVar5 = *(undefined8 *)__args->_M_elems;
            uVar6 = *(undefined8 *)(__args->_M_elems + 2);
            uVar7 = *(undefined8 *)(__args->_M_elems + 6);
            *(undefined8 *)((iVar4._M_current)->_M_elems + 4) =
                 *(undefined8 *)(__args->_M_elems + 4);
            *(undefined8 *)((iVar4._M_current)->_M_elems + 6) = uVar7;
            *(undefined8 *)(iVar4._M_current)->_M_elems = uVar5;
            *(undefined8 *)((iVar4._M_current)->_M_elems + 2) = uVar6;
            *(long *)(pvVar16 + 8) = *(long *)(pvVar16 + 8) + 0x20;
          }
          pvVar16 = (vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)
                    (local_90.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                    *(int *)((long)((this->edges).
                                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                            lVar14 + 8));
          flipAdjacencyInfo((array<int,_8UL> *)
                            ((long)((local_98->
                                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar14))
          ;
          iVar4._M_current = *(array<int,_8UL> **)(pvVar16 + 8);
          if (iVar4._M_current == *(array<int,_8UL> **)(pvVar16 + 0x10)) {
            std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
            _M_realloc_insert<std::array<int,8ul>>(pvVar16,iVar4,(array<int,_8UL> *)&local_128);
          }
          else {
            *(pointer *)((iVar4._M_current)->_M_elems + 4) =
                 local_128.adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(pointer *)((iVar4._M_current)->_M_elems + 6) =
                 local_128.adjacencyEdgeInfo.
                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)(iVar4._M_current)->_M_elems =
                 local_128.adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)((iVar4._M_current)->_M_elems + 2) =
                 local_128.adjacencyList.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            *(long *)(pvVar16 + 8) = *(long *)(pvVar16 + 8) + 0x20;
          }
          uVar19 = uVar19 + 1;
          paVar10 = (this->edges).
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar14 = lVar14 + 0x20;
        } while (uVar19 < (ulong)((long)(this->edges).
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar10
                                 >> 5));
      }
      local_128.nodes.
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.nodes.
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.adjacencyEdgeInfo.
      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.adjacencyEdgeInfo.
      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.adjacencyEdgeInfo.
      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.adjacencyList.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.nodes.
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator=(&local_128.adjacencyList,&local_78);
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::operator=(&local_128.adjacencyEdgeInfo,&local_90);
      std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
                (&local_128.nodes,&local_d8);
      std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
      push_back(local_138,&local_128);
      if (local_128.nodes.
          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.nodes.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&local_128.adjacencyEdgeInfo);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_128.adjacencyList);
      if (local_d8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&local_90);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_78);
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_130);
  }
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return local_138;
}

Assistant:

std::vector<AdjacencyListCrate> PartialUnion::createAdjacencyLists(std::vector<std::array<int, 8>> & newedges, int snapshots)
	{
		// RENAME IDS (so IDS are from 0 to N)
		int current_snapshot = 1;  // because first time stamp == 1
		std::map<int, int> new_node_ids;
		int id_counter = 0;

		vector<int> numbers_of_nodes; // how many nodes there are in each snapshot


		size_t edges_processed_index = 0;
		for (size_t i = 0; i <= nodes.size(); i++)
		{

			if (i == nodes.size() || nodes[i][PN_TIME] > current_snapshot)
			{
				// doing next snapshot
				numbers_of_nodes.push_back(id_counter);

				// rename edges
				for (; edges_processed_index < edges.size() && edges[edges_processed_index][PE_TIME] <= current_snapshot; edges_processed_index++)
				{
					edges[edges_processed_index][PE_SRC] = new_node_ids.find(edges[edges_processed_index][PE_SRC])->second;
					edges[edges_processed_index][PE_DST] = new_node_ids.find(edges[edges_processed_index][PE_DST])->second;
				}

				// after all elements are processed, end
				if (i == nodes.size()) break;
				// reset counters:

				current_snapshot++;

				id_counter = 0;
				new_node_ids.clear();

			}

			new_node_ids.insert(std::make_pair(nodes[i][PN_ID], id_counter));

			// rename node ids:
			nodes[i][PN_ID] = id_counter;

			id_counter++;
		}

		// BUILD ADJACENCY LISTS:
		std::vector<AdjacencyListCrate> adjacency_lists;
		current_snapshot = 1;
		size_t e_index = 0;
		size_t n_index = 0;
		for (int current_snapshot = 1; current_snapshot <= snapshots; current_snapshot++)
		{
			// for each snapshot
			// initialize vectors of appropriate sizes:
			std::vector<std::vector<int>> adjacencyList(numbers_of_nodes[current_snapshot - 1], std::vector<int>(0));
			std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacencyMoreInfo(
				numbers_of_nodes[current_snapshot - 1],
				std::vector<std::array<int, ADJ_INFO___SIZE>>(0)
			);
			std::vector<std::array<int, ADJ_NODES___SIZE>> adjacencyListNodes; // NEW

			while (n_index < nodes.size() && nodes[n_index][PN_TIME] <= current_snapshot)
			{
				// fill all nodes in the current snapshot:
				std::array<int, ADJ_NODES___SIZE> node = { nodes[n_index][PN_ID], nodes[n_index][PN_CHANGETIME], nodes[n_index][PN_LABEL] };
				adjacencyListNodes.push_back(node);
				n_index++;
			}
			while (e_index < edges.size() && edges[e_index][PE_TIME] <= current_snapshot)
			{
				// fill all edges of the current snapshot:
				adjacencyList[edges[e_index][PE_SRC]].push_back(edges[e_index][PE_DST]);
				adjacencyList[edges[e_index][PE_DST]].push_back(edges[e_index][PE_SRC]);
				adjacencyMoreInfo[edges[e_index][PE_SRC]].push_back(newedges[e_index]);
				adjacencyMoreInfo[edges[e_index][PE_DST]].push_back(flipAdjacencyInfo(newedges[e_index]));
				e_index++;
			}
			// create new struct element
			AdjacencyListCrate alc;
			alc.adjacencyList = adjacencyList;
			alc.adjacencyEdgeInfo = adjacencyMoreInfo;
			alc.nodes = adjacencyListNodes;
			adjacency_lists.push_back(alc);
		}


		return adjacency_lists;
	}